

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

uint gl4cts::TextureViewUtilities::getTextureDataSize
               (GLenum internalformat,GLenum type,uint width,uint height)

{
  uint local_38;
  uint texel_size;
  uint type_rgba_size [4];
  uint internalformat_rgba_size [4];
  uint height_local;
  uint width_local;
  GLenum type_local;
  GLenum internalformat_local;
  
  memset(type_rgba_size + 2,0,0x10);
  memset(&local_38,0,0x10);
  getComponentSizeForInternalformat(internalformat,type_rgba_size + 2);
  getComponentSizeForType(type,&local_38);
  if (type_rgba_size[2] == 0) {
    local_38 = 0;
  }
  if (type_rgba_size[3] == 0) {
    texel_size = 0;
  }
  if (internalformat_rgba_size[0] == 0) {
    type_rgba_size[0] = 0;
  }
  if (internalformat_rgba_size[1] == 0) {
    type_rgba_size[1] = 0;
  }
  return (local_38 + texel_size + type_rgba_size[0] + type_rgba_size[1] >> 3) * width * height;
}

Assistant:

unsigned int TextureViewUtilities::getTextureDataSize(const glw::GLenum internalformat, const glw::GLenum type,
													  const unsigned int width, const unsigned int height)
{
	unsigned int internalformat_rgba_size[4] = { 0 };
	unsigned int type_rgba_size[4]			 = { 0 };
	unsigned int texel_size					 = 0;

	TextureViewUtilities::getComponentSizeForInternalformat(internalformat, internalformat_rgba_size);
	TextureViewUtilities::getComponentSizeForType(type, type_rgba_size);

	if (internalformat_rgba_size[0] == 0)
	{
		type_rgba_size[0] = 0;
	}

	if (internalformat_rgba_size[1] == 0)
	{
		type_rgba_size[1] = 0;
	}

	if (internalformat_rgba_size[2] == 0)
	{
		type_rgba_size[2] = 0;
	}

	if (internalformat_rgba_size[3] == 0)
	{
		type_rgba_size[3] = 0;
	}

	texel_size = type_rgba_size[0] + type_rgba_size[1] + type_rgba_size[2] + type_rgba_size[3];

	/* Current implementation assumes we do not need to use bit resolution when
	 * preparing texel data. Make extra sure we're not wrong. */
	DE_ASSERT((texel_size % 8) == 0);

	texel_size /= 8; /* bits per byte */

	return texel_size * width * height;
}